

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysex.c
# Opt level: O1

void receive_sysex(void)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  FILE *__stream;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  PortMidiStream *midi;
  PmEvent msg;
  char line [80];
  PortMidiStream *local_98;
  PmEvent local_90;
  char local_88 [88];
  
  iVar1 = get_number("Type input device number: ");
  Pm_OpenInput(&local_98,iVar1,(void *)0x0,0x200,(PmTimeProcPtr)0x0,(void *)0x0);
  printf("Midi Input opened, type file for sysex data: ");
  fgets(local_88,0x50,_stdin);
  sVar4 = strlen(local_88);
  if (sVar4 != 0) {
    local_88[sVar4 - 1] = '\0';
  }
  __stream = fopen(local_88,"w");
  if (__stream == (FILE *)0x0) {
    printf("Could not open %s\n",local_88);
  }
  else {
    puts("Ready to receive a sysex message");
    uVar5 = 0;
    iVar1 = 0;
    do {
      iVar2 = Pm_Read(local_98,&local_90,1);
      if ((iVar2 != 0) && (uVar5 != 0xf7)) {
        uVar6 = 0;
        while( true ) {
          uVar3 = local_90.message >> ((byte)uVar6 & 0x1f);
          uVar5 = uVar3 & 0xff;
          if ((char)uVar3 < '\0' && uVar5 != 0xf7) break;
          fprintf(__stream,"%2x ",(ulong)uVar5);
          if (iVar1 < 0xf) {
            iVar1 = iVar1 + 1;
          }
          else {
            fputc(10,__stream);
            iVar1 = 0;
          }
          if ((uVar5 == 0xf7) || (bVar7 = 0x17 < uVar6, uVar6 = uVar6 + 8, bVar7)) break;
        }
      }
    } while (uVar5 != 0xf7);
    fclose(__stream);
  }
  Pm_Close(local_98);
  return;
}

Assistant:

void receive_sysex()
{
    char line[80];
    FILE *f;
    PmStream *midi;
    int shift = 0;
    int data = 0;
    int bytes_on_line = 0;
    PmEvent msg;

    /* determine which output device to use */
    int i = get_number("Type input device number: ");

    /* open input device */
    Pm_OpenInput(&midi, i, NULL, 512, NULL, NULL);
    printf("Midi Input opened, type file for sysex data: ");

    /* open file */
    fgets(line, STRING_MAX, stdin);
    /* remove the newline character */
    if (strlen(line) > 0) line[strlen(line) - 1] = 0;
    f = fopen(line, "w");
    if (!f) {
        printf("Could not open %s\n", line);
        Pm_Close(midi);
        return;
    }

    printf("Ready to receive a sysex message\n");

    /* read data and write to file */
    while (data != MIDI_EOX) {
        PmError count;
        count = Pm_Read(midi, &msg, 1);
        /* CAUTION: this causes busy waiting. It would be better to 
           be in a polling loop to avoid being compute bound. PortMidi
           does not support a blocking read since this is so seldom
           useful.
         */
        if (count == 0) continue;
        /* ignore real-time messages */
        if (is_real_time_msg(Pm_MessageStatus(msg.message))) continue;

        /* write 4 bytes of data until you reach an eox */
        for (shift = 0; shift < 32 && (data != MIDI_EOX); shift += 8) {
            data = (msg.message >> shift) & 0xFF;
            /* if this is a status byte that's not MIDI_EOX, the sysex
               message is incomplete and there is no more sysex data */
            if (data & 0x80 && data != MIDI_EOX) break;
            fprintf(f, "%2x ", data);
            if (++bytes_on_line >= 16) {
                fprintf(f, "\n");
                bytes_on_line = 0;
            }
        }
    }
    fclose(f);
    Pm_Close(midi);
}